

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptAsyncFunction * __thiscall
Js::JavascriptLibrary::CreateAsyncFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,
          GeneratorVirtualScriptFunction *scriptFunction)

{
  bool isAnonymousFunction;
  DynamicType *type;
  Recycler *recycler;
  JavascriptAsyncFunction *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  isAnonymousFunction =
       (bool)(**(code **)((long)(scriptFunction->super_ScriptFunction).super_ScriptFunctionBase.
                                super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                                super_FinalizableObject.super_IRecyclerVisitedObject + 0x3b8))
                       (scriptFunction);
  type = CreateDeferredPrototypeAsyncFunctionType(this,entryPoint,isAnonymousFunction,false);
  local_50 = (undefined1  [8])&JavascriptAsyncFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x19c1;
  recycler = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
  this_00 = (JavascriptAsyncFunction *)
            new<(Memory::ObjectInfoBits)1>
                      (0x38,recycler,(InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27)
  ;
  JavascriptAsyncFunction::JavascriptAsyncFunction(this_00,type,scriptFunction);
  return this_00;
}

Assistant:

JavascriptAsyncFunction* JavascriptLibrary::CreateAsyncFunction(JavascriptMethod entryPoint, GeneratorVirtualScriptFunction* scriptFunction)
    {
        DynamicType* type = CreateDeferredPrototypeAsyncFunctionType(entryPoint, scriptFunction->IsAnonymousFunction());

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptAsyncFunction, type, scriptFunction);
    }